

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

Board ** board_boardAddDups(Board **boards,unsigned_long boardsCount,Board *board,
                           unsigned_long boardNumToAdd)

{
  Board **ppBVar1;
  Board *pBVar2;
  Board *in_RCX;
  long in_RSI;
  void *in_RDI;
  unsigned_long i;
  Board *local_28;
  
  ppBVar1 = (Board **)realloc(in_RDI,(long)(&in_RCX->spotsCount + in_RSI) * 8);
  for (local_28 = (Board *)0x0; local_28 < in_RCX; local_28 = (Board *)&local_28->field_0x1) {
    pBVar2 = board_dup(in_RCX);
    ppBVar1[(long)(&local_28->spotsCount + in_RSI)] = pBVar2;
  }
  return ppBVar1;
}

Assistant:

Board ** board_boardAddDups(Board ** boards, unsigned long boardsCount, Board * board, unsigned long boardNumToAdd)
{
	unsigned long i;

	boards = (Board **)realloc(boards, sizeof(Board *)*(boardsCount+boardNumToAdd));
	for(i=0;i<boardNumToAdd;i++)
	{
		boards[boardsCount+i] = board_dup(board);
	}

	return boards;
}